

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O2

int send_list(socket_server *ss,socket *s,wb_list *list,socket_message *result)

{
  write_buffer *pwVar1;
  FILE *__stream;
  socklen_t __addr_len;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  int iVar6;
  sockaddr_all local_44;
  
  if (s->protocol == 0) {
    while (pwVar1 = list->head, pwVar1 != (write_buffer *)0x0) {
      while( true ) {
        sVar3 = write(s->fd,pwVar1->ptr,(long)pwVar1->sz);
        uVar2 = (uint)sVar3;
        if (-1 < (int)uVar2) break;
        piVar4 = __errno_location();
        if (*piVar4 != 4) {
          if (*piVar4 == 0xb) {
            return -1;
          }
          force_close(ss,s,result);
          return 1;
        }
      }
      s->wb_size = s->wb_size - (ulong)(uVar2 & 0x7fffffff);
      iVar6 = pwVar1->sz - uVar2;
      if (iVar6 != 0) {
        pwVar1->ptr = pwVar1->ptr + (uVar2 & 0x7fffffff);
        pwVar1->sz = iVar6;
        return -1;
      }
      list->head = pwVar1->next;
      write_buffer_free(ss,pwVar1);
    }
  }
  else {
    while (pwVar1 = list->head, pwVar1 != (write_buffer *)0x0) {
      __addr_len = udp_socket_address(s,pwVar1->udp_address,&local_44);
      sVar3 = sendto(s->fd,pwVar1->ptr,(long)pwVar1->sz,0,(sockaddr *)&local_44.s,__addr_len);
      if ((int)sVar3 < 0) {
        piVar4 = __errno_location();
        __stream = _stderr;
        iVar6 = *piVar4;
        if (iVar6 == 4) {
          return -1;
        }
        if (iVar6 == 0xb) {
          return -1;
        }
        uVar2 = s->id;
        pcVar5 = strerror(iVar6);
        fprintf(__stream,"socket-server : udp (%d) sendto error %s.\n",(ulong)uVar2,pcVar5);
        return -1;
      }
      s->wb_size = s->wb_size - (long)pwVar1->sz;
      list->head = pwVar1->next;
      write_buffer_free(ss,pwVar1);
    }
  }
  list->tail = (write_buffer *)0x0;
  return -1;
}

Assistant:

static int
send_list(struct socket_server *ss, struct socket *s, struct wb_list *list, struct socket_message *result) {
	if (s->protocol == PROTOCOL_TCP) {
		return send_list_tcp(ss, s, list, result);
	} else {
		return send_list_udp(ss, s, list, result);
	}
}